

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

QPushButton * __thiscall
QDialogButtonBoxPrivate::createButton
          (QDialogButtonBoxPrivate *this,StandardButton sbutton,LayoutRule layoutRule)

{
  QWidget *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ButtonRole role;
  QWidget *pQVar5;
  QStyle *style;
  QStyle *pQVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QPushButton *button;
  QKeySequence standardShortcut;
  QWidget *local_60;
  StandardButton local_54;
  pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar5 = (QWidget *)0x0;
  pQVar7 = (QWidget *)0x0;
  bVar2 = false;
  local_54 = sbutton;
  if ((int)sbutton < 0x40000) {
    if (0x1fff < (int)sbutton) {
      if ((int)sbutton < 0x8000) {
        if (sbutton == Open) {
          pQVar7 = (QWidget *)0x2a;
        }
        else {
          if (sbutton != Yes) goto LAB_00476c27;
          pQVar7 = (QWidget *)0x30;
        }
      }
      else if (sbutton == YesToAll) {
        pQVar7 = (QWidget *)0x47;
      }
      else if (sbutton == No) {
        pQVar7 = (QWidget *)0x31;
      }
      else {
        if (sbutton != NoToAll) goto LAB_00476c27;
        pQVar7 = (QWidget *)0x48;
      }
      goto LAB_00476c24;
    }
    if (0x7ff < (int)sbutton) {
      if (sbutton == Save) {
        pQVar7 = (QWidget *)0x2b;
      }
      else {
        if (sbutton != SaveAll) goto LAB_00476c27;
        pQVar7 = (QWidget *)0x49;
      }
      goto LAB_00476c24;
    }
    if (sbutton == NoButton) goto LAB_00476da2;
    if (sbutton == FirstButton) {
      pQVar7 = (QWidget *)0x27;
      goto LAB_00476c24;
    }
  }
  else {
    if ((int)sbutton < 0x800000) {
      if ((int)sbutton < 0x100000) {
        if (sbutton == Abort) {
          pQVar7 = (QWidget *)0x4a;
        }
        else {
          pQVar7 = pQVar5;
          bVar2 = false;
          if (sbutton != Retry) goto LAB_00476c27;
          pQVar7 = (QWidget *)0x4b;
        }
      }
      else if (sbutton == Ignore) {
        pQVar7 = (QWidget *)0x4c;
      }
      else if (sbutton == Close) {
        pQVar7 = (QWidget *)0x2c;
      }
      else {
        pQVar7 = pQVar5;
        bVar2 = false;
        if (sbutton != Cancel) goto LAB_00476c27;
        pQVar7 = (QWidget *)0x28;
      }
    }
    else if ((int)sbutton < 0x2000000) {
      if (sbutton == Discard) {
        pQVar7 = (QWidget *)0x2f;
      }
      else {
        if (sbutton != Help) goto LAB_00476c27;
        pQVar7 = (QWidget *)0x29;
      }
    }
    else if (sbutton == Apply) {
      pQVar7 = (QWidget *)0x2d;
    }
    else if (sbutton == Reset) {
      pQVar7 = (QWidget *)0x2e;
    }
    else {
      pQVar7 = pQVar5;
      if (sbutton != LastButton) goto LAB_00476c27;
      pQVar7 = (QWidget *)0x4d;
    }
LAB_00476c24:
    bVar2 = true;
  }
LAB_00476c27:
  pQVar5 = (QWidget *)operator_new(0x28);
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x88))
            (&local_50,QGuiApplicationPrivate::platform_theme,sbutton);
  QPushButton::QPushButton((QPushButton *)pQVar5,(QString *)&local_50,pQVar1);
  if (local_50.first.c != (containers *)0x0) {
    LOCK();
    *(int *)&((local_50.first.c)->keys).super_QVLABase<QPushButton_*>.super_QVLABaseBase.a =
         (int)((local_50.first.c)->keys).super_QVLABase<QPushButton_*>.super_QVLABaseBase.a + -1;
    UNLOCK();
    if ((int)((local_50.first.c)->keys).super_QVLABase<QPushButton_*>.super_QVLABaseBase.a == 0) {
      QArrayData::deallocate((QArrayData *)local_50.first.c,2,0x10);
    }
  }
  local_60 = pQVar5;
  style = QWidget::style(pQVar1);
  iVar4 = (**(code **)(*(long *)style + 0xf0))(style,0x47,0,pQVar1);
  pQVar1 = local_60;
  if (bVar2 && iVar4 != 0) {
    (**(code **)(*(long *)style + 0x100))(&local_50,style,pQVar7,0);
    QAbstractButton::setIcon((QAbstractButton *)pQVar1,(QIcon *)&local_50);
    QIcon::~QIcon((QIcon *)&local_50);
  }
  pQVar6 = QApplication::style();
  if (style != pQVar6) {
    QWidget::setStyle(local_60,style);
  }
  QFlatMap<QPushButton*,QDialogButtonBox::StandardButton,std::less<QPushButton*>,QVarLengthArray<QPushButton*,8ll>,QVarLengthArray<QDialogButtonBox::StandardButton,8ll>>
  ::try_emplace<QDialogButtonBox::StandardButton_const&>
            (&local_50,&this->standardButtonMap,(QPushButton **)&local_60,&local_54);
  role = QPlatformDialogHelper::buttonRole(local_54);
  if (role == InvalidRole) {
    createButton();
  }
  else {
    addButton(this,(QAbstractButton *)local_60,role,layoutRule,Connect);
  }
  local_50.first.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x90))
            (&local_50,QGuiApplicationPrivate::platform_theme,local_54);
  cVar3 = QKeySequence::isEmpty();
  if (cVar3 == '\0') {
    QAbstractButton::setShortcut((QAbstractButton *)local_60,(QKeySequence *)&local_50);
  }
  pQVar5 = local_60;
  QKeySequence::~QKeySequence((QKeySequence *)&local_50);
LAB_00476da2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QPushButton *)pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QPushButton *QDialogButtonBoxPrivate::createButton(QDialogButtonBox::StandardButton sbutton,
                                                   LayoutRule layoutRule)
{
    Q_Q(QDialogButtonBox);
    int icon = 0;

    switch (sbutton) {
    case QDialogButtonBox::Ok:
        icon = QStyle::SP_DialogOkButton;
        break;
    case QDialogButtonBox::Save:
        icon = QStyle::SP_DialogSaveButton;
        break;
    case QDialogButtonBox::Open:
        icon = QStyle::SP_DialogOpenButton;
        break;
    case QDialogButtonBox::Cancel:
        icon = QStyle::SP_DialogCancelButton;
        break;
    case QDialogButtonBox::Close:
        icon = QStyle::SP_DialogCloseButton;
        break;
    case QDialogButtonBox::Apply:
        icon = QStyle::SP_DialogApplyButton;
        break;
    case QDialogButtonBox::Reset:
        icon = QStyle::SP_DialogResetButton;
        break;
    case QDialogButtonBox::Help:
        icon = QStyle::SP_DialogHelpButton;
        break;
    case QDialogButtonBox::Discard:
        icon = QStyle::SP_DialogDiscardButton;
        break;
    case QDialogButtonBox::Yes:
        icon = QStyle::SP_DialogYesButton;
        break;
    case QDialogButtonBox::No:
        icon = QStyle::SP_DialogNoButton;
        break;
    case QDialogButtonBox::YesToAll:
        icon = QStyle::SP_DialogYesToAllButton;
        break;
    case QDialogButtonBox::NoToAll:
        icon = QStyle::SP_DialogNoToAllButton;
        break;
    case QDialogButtonBox::SaveAll:
        icon = QStyle::SP_DialogSaveAllButton;
        break;
    case QDialogButtonBox::Abort:
        icon = QStyle::SP_DialogAbortButton;
        break;
    case QDialogButtonBox::Retry:
        icon = QStyle::SP_DialogRetryButton;
        break;
    case QDialogButtonBox::Ignore:
        icon = QStyle::SP_DialogIgnoreButton;
        break;
    case QDialogButtonBox::RestoreDefaults:
        icon = QStyle::SP_RestoreDefaultsButton;
        break;
    case QDialogButtonBox::NoButton:
        return nullptr;
        ;
    }
    QPushButton *button = new QPushButton(QGuiApplicationPrivate::platformTheme()->standardButtonText(sbutton), q);
    QStyle *style = q->style();
    if (style->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, q) && icon != 0)
        button->setIcon(style->standardIcon(QStyle::StandardPixmap(icon), nullptr, q));
    if (style != QApplication::style()) // Propagate style
        button->setStyle(style);
    standardButtonMap.insert(button, sbutton);
    QPlatformDialogHelper::ButtonRole role = QPlatformDialogHelper::buttonRole(static_cast<QPlatformDialogHelper::StandardButton>(sbutton));
    if (Q_UNLIKELY(role == QPlatformDialogHelper::InvalidRole))
        qWarning("QDialogButtonBox::createButton: Invalid ButtonRole, button not added");
    else
        addButton(button, static_cast<QDialogButtonBox::ButtonRole>(role), layoutRule);
#if QT_CONFIG(shortcut)
    const QKeySequence standardShortcut = QGuiApplicationPrivate::platformTheme()->standardButtonShortcut(sbutton);
    if (!standardShortcut.isEmpty())
        button->setShortcut(standardShortcut);
#endif
    return button;
}